

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

OnCallSpec<test_result_(unsigned_int)> * __thiscall
testing::internal::FunctionMockerBase<test_result_(unsigned_int)>::AddNewOnCallSpec
          (FunctionMockerBase<test_result_(unsigned_int)> *this,char *file,int line,
          ArgumentMatcherTuple *m)

{
  OnCallSpec<test_result_(unsigned_int)> *pOVar1;
  OnCallSpec<test_result_(unsigned_int)> *in_RCX;
  vector<const_void_*,_std::allocator<const_void_*>_> *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  void *in_stack_00000010;
  OnCallSpec<test_result_(unsigned_int)> *on_call_spec;
  value_type *in_stack_ffffffffffffffa8;
  ArgumentMatcherTuple *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::MockObject
            ((UntypedFunctionMockerBase *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  Mock::RegisterUseByOnCallOrExpectCall(in_stack_00000010,in_stack_00000008,unaff_retaddr_00);
  pOVar1 = (OnCallSpec<test_result_(unsigned_int)> *)operator_new(0x50);
  OnCallSpec<test_result_(unsigned_int)>::OnCallSpec
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffffa8);
  return pOVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    OnCallSpec<F>* const on_call_spec = new OnCallSpec<F>(file, line, m);
    untyped_on_call_specs_.push_back(on_call_spec);
    return *on_call_spec;
  }